

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

void LoadFunction(LoadState *S,Proto *f,TString *psource)

{
  undefined8 *puVar1;
  lu_byte lVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  ravi_type_map rVar7;
  TString *pTVar8;
  Instruction *b;
  TValue *pTVar9;
  lua_Integer lVar10;
  Upvaldesc *pUVar11;
  Proto **ppPVar12;
  Proto *pPVar13;
  int *b_00;
  LocVar *pLVar14;
  char *__assertion;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  lua_Number lVar19;
  
  pTVar8 = LoadString(S);
  if (pTVar8 != (TString *)0x0) {
    psource = pTVar8;
  }
  f->source = psource;
  iVar5 = LoadInt(S);
  f->linedefined = iVar5;
  iVar5 = LoadInt(S);
  f->lastlinedefined = iVar5;
  lVar2 = LoadByte(S);
  f->numparams = lVar2;
  lVar2 = LoadByte(S);
  f->is_vararg = lVar2;
  lVar2 = LoadByte(S);
  f->maxstacksize = lVar2;
  iVar5 = LoadInt(S);
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar5 * 4);
  f->code = b;
  f->sizecode = iVar5;
  LoadBlock(S,b,(long)iVar5 * 4);
  uVar6 = LoadInt(S);
  pTVar9 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar6 << 4);
  f->k = pTVar9;
  f->sizek = uVar6;
  lVar17 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6) << 4;
  for (lVar15 = 0; lVar17 != lVar15; lVar15 = lVar15 + 0x10) {
    *(undefined2 *)((long)&pTVar9->tt_ + lVar15) = 0;
  }
  lVar15 = 0;
  do {
    if (lVar17 == lVar15) {
      uVar6 = LoadInt(S);
      pUVar11 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar6 * 0x18);
      f->upvalues = pUVar11;
      f->sizeupvalues = uVar6;
      lVar17 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6) * 0x18;
      for (lVar15 = 0; lVar17 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
        puVar1 = (undefined8 *)((long)&pUVar11->name + lVar15);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&pUVar11->ravi_type_map + lVar15) = 0xffffffff;
      }
      for (lVar15 = 0; lVar17 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
        lVar2 = LoadByte(S);
        (&f->upvalues->instack)[lVar15] = lVar2;
        lVar2 = LoadByte(S);
        (&f->upvalues->idx)[lVar15] = lVar2;
      }
      uVar6 = LoadInt(S);
      ppPVar12 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar6 * 8);
      f->p = ppPVar12;
      f->sizep = uVar6;
      uVar18 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
      for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
        f->p[uVar16] = (Proto *)0x0;
      }
      for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
        pPVar13 = luaF_newproto(S->L);
        f->p[uVar16] = pPVar13;
        LoadFunction(S,f->p[uVar16],f->source);
      }
      iVar5 = LoadInt(S);
      b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar5 * 4);
      f->lineinfo = b_00;
      f->sizelineinfo = iVar5;
      LoadBlock(S,b_00,(long)iVar5 * 4);
      uVar6 = LoadInt(S);
      pLVar14 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar6 << 5);
      f->locvars = pLVar14;
      f->sizelocvars = uVar6;
      lVar17 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6) << 5;
      for (lVar15 = 0; lVar17 != lVar15; lVar15 = lVar15 + 0x20) {
        puVar1 = (undefined8 *)((long)&pLVar14->varname + lVar15);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      for (lVar15 = 0; lVar17 != lVar15; lVar15 = lVar15 + 0x20) {
        pTVar8 = LoadString(S);
        *(TString **)((long)&f->locvars->varname + lVar15) = pTVar8;
        iVar5 = LoadInt(S);
        *(int *)((long)&f->locvars->startpc + lVar15) = iVar5;
        iVar5 = LoadInt(S);
        *(int *)((long)&f->locvars->endpc + lVar15) = iVar5;
        if (S->version == '\0') {
          lVar2 = LoadByte(S);
          rVar7 = ravi_map_old_type_to_new(lVar2);
        }
        else {
          rVar7 = LoadInt(S);
        }
        *(ravi_type_map *)((long)&f->locvars->ravi_type_map + lVar15) = rVar7;
        pTVar8 = LoadString(S);
        *(TString **)((long)&f->locvars->usertype + lVar15) = pTVar8;
      }
      uVar6 = LoadInt(S);
      for (lVar15 = 0; (ulong)(~((int)uVar6 >> 0x1f) & uVar6) * 0x18 - lVar15 != 0;
          lVar15 = lVar15 + 0x18) {
        pTVar8 = LoadString(S);
        *(TString **)((long)&f->upvalues->name + lVar15) = pTVar8;
        if (S->version == '\0') {
          lVar2 = LoadByte(S);
          rVar7 = ravi_map_old_type_to_new(lVar2);
        }
        else {
          rVar7 = LoadInt(S);
        }
        *(ravi_type_map *)((long)&f->upvalues->ravi_type_map + lVar15) = rVar7;
        pTVar8 = LoadString(S);
        *(TString **)((long)&f->upvalues->usertype + lVar15) = pTVar8;
      }
      return;
    }
    pTVar9 = f->k;
    lVar2 = LoadByte(S);
    switch(lVar2) {
    case '\0':
      uVar4 = 0;
      break;
    case '\x01':
      bVar3 = LoadByte(S);
      *(uint *)((long)&pTVar9->value_ + lVar15) = (uint)bVar3;
      uVar4 = 1;
      break;
    case '\x02':
switchD_00139c91_caseD_2:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                    ,0x97,"void LoadConstants(LoadState *, Proto *)");
    case '\x03':
      lVar19 = LoadNumber(S);
      *(lua_Number *)((long)&pTVar9->value_ + lVar15) = lVar19;
      uVar4 = 3;
      break;
    case '\x04':
switchD_00139c91_caseD_4:
      pTVar8 = LoadString(S);
      if (9 < (pTVar8->tt & 0xe)) {
        __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_00139fca:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                      ,0x94,"void LoadConstants(LoadState *, Proto *)");
      }
      *(TString **)((long)&pTVar9->value_ + lVar15) = pTVar8;
      bVar3 = pTVar8->tt;
      *(ushort *)((long)&pTVar9->tt_ + lVar15) = bVar3 | 0x8000;
      if (((char)bVar3 < '\0') ||
         ((S->L != (lua_State *)0x0 && ((pTVar8->marked & (S->L->l_G->currentwhite ^ 0x18)) != 0))))
      {
        __assertion = "0";
        goto LAB_00139fca;
      }
      goto LAB_00139d40;
    default:
      if (lVar2 != '\x13') {
        if (lVar2 != '\x14') goto switchD_00139c91_caseD_2;
        goto switchD_00139c91_caseD_4;
      }
      lVar10 = LoadInteger(S);
      *(lua_Integer *)((long)&pTVar9->value_ + lVar15) = lVar10;
      uVar4 = 0x13;
    }
    *(undefined2 *)((long)&pTVar9->tt_ + lVar15) = uVar4;
LAB_00139d40:
    lVar15 = lVar15 + 0x10;
  } while( true );
}

Assistant:

static void LoadFunction (LoadState *S, Proto *f, TString *psource) {
  f->source = LoadString(S);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = LoadInt(S);
  f->lastlinedefined = LoadInt(S);
  f->numparams = LoadByte(S);
  f->is_vararg = LoadByte(S);
  f->maxstacksize = LoadByte(S);
  LoadCode(S, f);
  LoadConstants(S, f);
  LoadUpvalues(S, f);
  LoadProtos(S, f);
  LoadDebug(S, f);
}